

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_file_types.cpp
# Opt level: O0

bool crnlib::texture_file_types::supports_alpha(format fmt)

{
  bool local_9;
  format fmt_local;
  
  if ((((uint)(fmt + ~cFormatPNG) < 2) || (fmt == cFormatGIF)) || (fmt == cFormatJP2)) {
    local_9 = false;
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool texture_file_types::supports_alpha(format fmt) {
  switch (fmt) {
    case cFormatJPG:
    case cFormatJPEG:
    case cFormatGIF:
    case cFormatJP2:
      return false;
    default:
      break;
  }

  return true;
}